

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

int lyp_yin_parse_complex_ext
              (lys_module *mod,lys_ext_instance_complex *ext,lyxml_elem *yin,unres_schema *unres)

{
  ly_ctx *ctx;
  int iVar1;
  void *pvVar2;
  long lVar3;
  ushort **ppuVar4;
  int *piVar5;
  ulong uVar6;
  longlong lVar7;
  lys_module *plVar8;
  lys_when *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  size_t sVar12;
  LY_ERR *pLVar13;
  int local_b0;
  int local_ac;
  int j;
  int i;
  unsigned_long u;
  longlong ll;
  long v;
  lyext_substmt *info;
  char *pcStack_80;
  char modifier;
  char *endptr;
  char *name;
  char *value;
  void *reallocated;
  void *p;
  void **pp;
  lys_type **type;
  lyxml_elem *child;
  lyxml_elem *node;
  lyxml_elem *next;
  unres_schema *unres_local;
  lyxml_elem *yin_local;
  lys_ext_instance_complex *ext_local;
  lys_module *mod_local;
  
  child = yin->child;
  next = (lyxml_elem *)unres;
  unres_local = (unres_schema *)yin;
  yin_local = (lyxml_elem *)ext;
  ext_local = (lys_ext_instance_complex *)mod;
  do {
    if (child == (lyxml_elem *)0x0) {
      if ((yin_local->content == (char *)0x0) ||
         (iVar1 = lyp_mand_check_ext((lys_ext_instance_complex *)yin_local,
                                     (char *)unres_local[1].type), iVar1 == 0)) {
        mod_local._4_4_ = 0;
      }
      else {
        mod_local._4_4_ = 1;
      }
      return mod_local._4_4_;
    }
    node = child->next;
    if (child->ns == (lyxml_ns *)0x0) {
LAB_00147e8a:
      lyxml_free((ly_ctx *)ext_local->def,child);
    }
    else {
      if (((child->ns == (lyxml_ns *)unres_local[1].str_snode) &&
          (((ulong)yin_local->child & 1) != 0)) &&
         (child->name == *(char **)(*(long *)yin_local + 0x28))) {
        if (yin_local->attr != (lyxml_attr *)0x0) {
          ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,child->name,
                  unres_local[1].type);
          return 1;
        }
        yin_local->attr = (lyxml_attr *)child->content;
        child->content = (char *)0x0;
        goto LAB_00147e8a;
      }
      iVar1 = strcmp(child->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
      if (iVar1 != 0) {
        iVar1 = lyp_yin_parse_subnode_ext
                          ((lys_module *)ext_local,yin_local,LYEXT_PAR_EXTINST,child,
                           LYEXT_SUBSTMT_SELF,'\0',(unres_schema *)next);
joined_r0x001452f7:
        if (iVar1 != 0) {
          return 1;
        }
        goto LAB_00147e8a;
      }
      iVar1 = strcmp(child->name,"description");
      if (iVar1 == 0) {
        iVar1 = yin_parse_extcomplex_str
                          ((lys_module *)ext_local,child,(lys_ext_instance_complex *)yin_local,
                           LY_STMT_DESCRIPTION,1,"text",(unres_schema *)next);
        goto joined_r0x001452f7;
      }
      iVar1 = strcmp(child->name,"reference");
      if (iVar1 == 0) {
        iVar1 = yin_parse_extcomplex_str
                          ((lys_module *)ext_local,child,(lys_ext_instance_complex *)yin_local,
                           LY_STMT_REFERENCE,1,"text",(unres_schema *)next);
        goto joined_r0x001452f7;
      }
      iVar1 = strcmp(child->name,"units");
      if (iVar1 == 0) {
        iVar1 = yin_parse_extcomplex_str
                          ((lys_module *)ext_local,child,(lys_ext_instance_complex *)yin_local,
                           LY_STMT_UNITS,0,"name",(unres_schema *)next);
        goto joined_r0x001452f7;
      }
      iVar1 = strcmp(child->name,"type");
      if (iVar1 != 0) {
        iVar1 = strcmp(child->name,"typedef");
        if (iVar1 == 0) {
          p = yin_getplace_for_extcomplex_struct
                        (child,(lys_ext_instance_complex *)yin_local,LY_STMT_TYPEDEF);
          if ((void **)p == (void **)0x0) {
            return 1;
          }
          pvVar2 = calloc(1,0x80);
          *(void **)p = pvVar2;
          if (*p == 0) {
            ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyp_yin_parse_complex_ext");
            return 1;
          }
          iVar1 = fill_yin_typedef((lys_module *)ext_local,(lys_node *)yin_local,child,*p,
                                   (unres_schema *)next);
        }
        else {
          iVar1 = strcmp(child->name,"if-feature");
          if (iVar1 == 0) {
            p = yin_getplace_for_extcomplex_struct
                          (child,(lys_ext_instance_complex *)yin_local,LY_STMT_IFFEATURE);
            if ((void **)p == (void **)0x0) {
              return 1;
            }
            pvVar2 = calloc(1,0x20);
            *(void **)p = pvVar2;
            if (*p == 0) {
              ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyp_yin_parse_complex_ext");
              return 1;
            }
            iVar1 = fill_yin_iffeature((lys_node *)yin_local,0,child,*p,(unres_schema *)next);
          }
          else {
            iVar1 = strcmp(child->name,"status");
            if (iVar1 == 0) {
              reallocated = yin_getplace_for_extcomplex_flags
                                      (child,(lys_ext_instance_complex *)yin_local,LY_STMT_STATUS,
                                       0x38);
              if (reallocated == (void *)0x0) {
                return 1;
              }
              name = lyxml_get_attr(child,"value",(char *)0x0);
              if (name == (char *)0x0) {
                ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",
                        child->name);
                return 1;
              }
              iVar1 = strcmp(name,"current");
              if (iVar1 == 0) {
                *(ushort *)reallocated = *reallocated | 8;
              }
              else {
                iVar1 = strcmp(name,"deprecated");
                if (iVar1 == 0) {
                  *(ushort *)reallocated = *reallocated | 0x10;
                }
                else {
                  iVar1 = strcmp(name,"obsolete");
                  if (iVar1 != 0) {
                    ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,LY_VLOG_NONE,(void *)0x0,name,
                            child->name);
                    return 1;
                  }
                  *(ushort *)reallocated = *reallocated | 0x20;
                }
              }
              iVar1 = lyp_yin_parse_subnode_ext
                                ((lys_module *)ext_local,yin_local,LYEXT_PAR_EXTINST,child,
                                 LYEXT_SUBSTMT_STATUS,'\0',(unres_schema *)next);
            }
            else {
              iVar1 = strcmp(child->name,"config");
              if (iVar1 == 0) {
                iVar1 = yin_parse_extcomplex_flag
                                  ((lys_module *)ext_local,child,
                                   (lys_ext_instance_complex *)yin_local,LY_STMT_MANDATORY,"true",
                                   "false",3,5,6,(unres_schema *)next);
              }
              else {
                iVar1 = strcmp(child->name,"argument");
                if (iVar1 == 0) {
                  iVar1 = yin_parse_extcomplex_str
                                    ((lys_module *)ext_local,child,
                                     (lys_ext_instance_complex *)yin_local,LY_STMT_ARGUMENT,0,"name"
                                     ,(unres_schema *)next);
                }
                else {
                  iVar1 = strcmp(child->name,"default");
                  if (iVar1 == 0) {
                    iVar1 = yin_parse_extcomplex_str
                                      ((lys_module *)ext_local,child,
                                       (lys_ext_instance_complex *)yin_local,LY_STMT_DEFAULT,0,
                                       "value",(unres_schema *)next);
                  }
                  else {
                    iVar1 = strcmp(child->name,"mandatory");
                    if (iVar1 == 0) {
                      iVar1 = yin_parse_extcomplex_flag
                                        ((lys_module *)ext_local,child,
                                         (lys_ext_instance_complex *)yin_local,LY_STMT_MANDATORY,
                                         "true","false",0xc0,0x40,0x80,(unres_schema *)next);
                    }
                    else {
                      iVar1 = strcmp(child->name,"error-app-tag");
                      if (iVar1 == 0) {
                        iVar1 = yin_parse_extcomplex_str
                                          ((lys_module *)ext_local,child,
                                           (lys_ext_instance_complex *)yin_local,LY_STMT_ERRTAG,0,
                                           "value",(unres_schema *)next);
                      }
                      else {
                        iVar1 = strcmp(child->name,"error-message");
                        if (iVar1 == 0) {
                          iVar1 = yin_parse_extcomplex_str
                                            ((lys_module *)ext_local,child,
                                             (lys_ext_instance_complex *)yin_local,LY_STMT_ERRMSG,1,
                                             "value",(unres_schema *)next);
                        }
                        else {
                          iVar1 = strcmp(child->name,"prefix");
                          if (iVar1 == 0) {
                            iVar1 = yin_parse_extcomplex_str
                                              ((lys_module *)ext_local,child,
                                               (lys_ext_instance_complex *)yin_local,LY_STMT_PREFIX,
                                               0,"value",(unres_schema *)next);
                          }
                          else {
                            iVar1 = strcmp(child->name,"namespace");
                            if (iVar1 == 0) {
                              iVar1 = yin_parse_extcomplex_str
                                                ((lys_module *)ext_local,child,
                                                 (lys_ext_instance_complex *)yin_local,
                                                 LY_STMT_NAMESPACE,0,"uri",(unres_schema *)next);
                            }
                            else {
                              iVar1 = strcmp(child->name,"presence");
                              if (iVar1 == 0) {
                                iVar1 = yin_parse_extcomplex_str
                                                  ((lys_module *)ext_local,child,
                                                   (lys_ext_instance_complex *)yin_local,
                                                   LY_STMT_PRESENCE,0,"value",(unres_schema *)next);
                              }
                              else {
                                iVar1 = strcmp(child->name,"revision-date");
                                if (iVar1 == 0) {
                                  iVar1 = yin_parse_extcomplex_str
                                                    ((lys_module *)ext_local,child,
                                                     (lys_ext_instance_complex *)yin_local,
                                                     LY_STMT_REVISIONDATE,0,"date",
                                                     (unres_schema *)next);
                                }
                                else {
                                  iVar1 = strcmp(child->name,"key");
                                  if (iVar1 == 0) {
                                    iVar1 = yin_parse_extcomplex_str
                                                      ((lys_module *)ext_local,child,
                                                       (lys_ext_instance_complex *)yin_local,
                                                       LY_STMT_KEY,0,"value",(unres_schema *)next);
                                  }
                                  else {
                                    iVar1 = strcmp(child->name,"base");
                                    if (iVar1 == 0) {
                                      iVar1 = yin_parse_extcomplex_str
                                                        ((lys_module *)ext_local,child,
                                                         (lys_ext_instance_complex *)yin_local,
                                                         LY_STMT_BASE,0,"name",(unres_schema *)next)
                                      ;
                                    }
                                    else {
                                      iVar1 = strcmp(child->name,"ordered-by");
                                      if (iVar1 == 0) {
                                        iVar1 = yin_parse_extcomplex_flag
                                                          ((lys_module *)ext_local,child,
                                                           (lys_ext_instance_complex *)yin_local,
                                                           LY_STMT_ORDEREDBY,"user","system",0x100,
                                                           0x100,0,(unres_schema *)next);
                                      }
                                      else {
                                        iVar1 = strcmp(child->name,"belongs-to");
                                        if (iVar1 == 0) {
                                          iVar1 = yin_parse_extcomplex_str
                                                            ((lys_module *)ext_local,child,
                                                             (lys_ext_instance_complex *)yin_local,
                                                             LY_STMT_BELONGSTO,0,"module",
                                                             (unres_schema *)next);
                                        }
                                        else {
                                          iVar1 = strcmp(child->name,"contact");
                                          if (iVar1 == 0) {
                                            iVar1 = yin_parse_extcomplex_str
                                                              ((lys_module *)ext_local,child,
                                                               (lys_ext_instance_complex *)yin_local
                                                               ,LY_STMT_CONTACT,1,"text",
                                                               (unres_schema *)next);
                                          }
                                          else {
                                            iVar1 = strcmp(child->name,"organization");
                                            if (iVar1 == 0) {
                                              iVar1 = yin_parse_extcomplex_str
                                                                ((lys_module *)ext_local,child,
                                                                 (lys_ext_instance_complex *)
                                                                 yin_local,LY_STMT_ORGANIZATION,1,
                                                                 "text",(unres_schema *)next);
                                            }
                                            else {
                                              iVar1 = strcmp(child->name,"path");
                                              if (iVar1 == 0) {
                                                iVar1 = yin_parse_extcomplex_str
                                                                  ((lys_module *)ext_local,child,
                                                                   (lys_ext_instance_complex *)
                                                                   yin_local,LY_STMT_PATH,0,"value",
                                                                   (unres_schema *)next);
                                              }
                                              else {
                                                iVar1 = strcmp(child->name,"require-instance");
                                                if (iVar1 == 0) {
                                                  iVar1 = yin_parse_extcomplex_bool
                                                                    ((lys_module *)ext_local,child,
                                                                     (lys_ext_instance_complex *)
                                                                     yin_local,LY_STMT_REQINSTANCE,
                                                                     "true","false",
                                                                     (unres_schema *)next);
                                                }
                                                else {
                                                  iVar1 = strcmp(child->name,"modifier");
                                                  if (iVar1 != 0) {
                                                    iVar1 = strcmp(child->name,"fraction-digits");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_DIGITS,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     ((char)*reallocated != '\0')) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(2);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    for (local_ac = 0;
                                                        *(char *)(*reallocated + (long)local_ac) !=
                                                        '\0'; local_ac = local_ac + 1) {
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  lVar3 = strtol(name,(char **)0x0,10);
                                                  if ((lVar3 < 1) || (0x12 < lVar3)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                            LY_VLOG_NONE,(void *)0x0,name,
                                                            child->name);
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_STATUS,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  *(char *)reallocated = (char)lVar3;
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined1 *)(*p + (long)(local_ac + 1)) = 0;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"max-elements");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_MAX,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  while (ppuVar4 = __ctype_b_loc(),
                                                        ((*ppuVar4)[(int)*name] & 0x2000) != 0) {
                                                    name = name + 1;
                                                  }
                                                  iVar1 = strcmp(name,"unbounded");
                                                  if (iVar1 == 0) {
                                                    _j = 0;
                                                  }
                                                  else {
                                                    piVar5 = __errno_location();
                                                    *piVar5 = 0;
                                                    pcStack_80 = (char *)0x0;
                                                    _j = strtoul(name,&stack0xffffffffffffff80,10);
                                                    if ((((*pcStack_80 != '\0') || (*name == '-'))
                                                        || (piVar5 = __errno_location(),
                                                           *piVar5 != 0)) ||
                                                       ((_j == 0 || (0xffffffff < _j)))) {
                                                      ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                              LY_VLOG_NONE,(void *)0x0,name,
                                                              child->name);
                                                      return 1;
                                                    }
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_MAX,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  pvVar2 = malloc(4);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  **reallocated = (int)_j;
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"min-elements");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_MIN,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  while (ppuVar4 = __ctype_b_loc(),
                                                        ((*ppuVar4)[(int)*name] & 0x2000) != 0) {
                                                    name = name + 1;
                                                  }
                                                  piVar5 = __errno_location();
                                                  *piVar5 = 0;
                                                  pcStack_80 = (char *)0x0;
                                                  uVar6 = strtoul(name,&stack0xffffffffffffff80,10);
                                                  if (((*pcStack_80 != '\0') || (*name == '-')) ||
                                                     ((piVar5 = __errno_location(), *piVar5 != 0 ||
                                                      (0xffffffff < uVar6)))) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                            LY_VLOG_NONE,(void *)0x0,name,
                                                            child->name);
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_MAX,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  pvVar2 = malloc(4);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  **reallocated = (int)uVar6;
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"value");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_VALUE,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  while (ppuVar4 = __ctype_b_loc(),
                                                        ((*ppuVar4)[(int)*name] & 0x2000) != 0) {
                                                    name = name + 1;
                                                  }
                                                  lVar7 = strtoll(name,(char **)0x0,10);
                                                  if ((lVar7 < -0x80000000) || (0x7fffffff < lVar7))
                                                  {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                            LY_VLOG_NONE,(void *)0x0,name,
                                                            child->name);
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_VALUE,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  pvVar2 = malloc(4);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  **reallocated = (int)lVar7;
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"position");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_POSITION,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  lVar7 = strtoll(name,(char **)0x0,10);
                                                  if ((lVar7 < 0) || (0xffffffff < lVar7)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                            LY_VLOG_NONE,(void *)0x0,name,
                                                            child->name);
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_POSITION,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  pvVar2 = malloc(4);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  **reallocated = (int)lVar7;
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"module");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_struct
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,
                                                                     LY_STMT_MODULE);
                                                      if ((void **)p == (void **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar8 = yin_read_module_((ly_ctx *)
                                                                                ext_local->def,child
                                                                                ,(char *)0x0,
                                                                                *(ushort *)
                                                                                 &ext_local->substmt
                                                                                >> 7 & 1);
                                                      *(lys_module **)p = plVar8;
                                                      plVar10 = *p;
joined_r0x00147269:
                                                      if (plVar10 == (lys_node *)0x0) {
                                                        return 1;
                                                      }
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"when");
                                                      if (iVar1 == 0) {
                                                        reallocated = lys_ext_complex_get_substmt
                                                                                (LY_STMT_WHEN,
                                                                                 (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  plVar9 = read_yin_when((lys_module *)ext_local,
                                                                         child,(unres_schema *)next)
                                                  ;
                                                  *(lys_when **)reallocated = plVar9;
                                                  if (*reallocated == 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"revision");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_REVISION,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  pvVar2 = calloc(1,0x28);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  iVar1 = fill_yin_revision((lys_module *)ext_local,
                                                                            child,*reallocated,
                                                                            (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    for (local_b0 = 0; local_b0 < local_ac;
                                                        local_b0 = local_b0 + 1) {
                                                      iVar1 = strcmp(*(char **)(*p + (long)local_b0
                                                                                     * 8),
                                                                     *reallocated);
                                                      if (iVar1 == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLWRN,
                                                               LY_SUCCESS,
                                                                                                                              
                                                  "Module\'s revisions are not unique (%s).");
                                                  }
                                                  }
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"unique");
                                                    if (iVar1 != 0) {
                                                      iVar1 = strcmp(child->name,"action");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_ACTION);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_rpc_action((lys_module *)
                                                                                ext_local,
                                                                                (lys_node *)
                                                                                yin_local,child,1,
                                                                                (unres_schema *)next
                                                                               );
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"anydata");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,
                                                                     LY_STMT_ANYDATA);
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_anydata((lys_module *)
                                                                                 ext_local,
                                                                                 (lys_node *)
                                                                                 yin_local,child,
                                                                                 LYS_ANYDATA,1,
                                                                                 (unres_schema *)
                                                                                 next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"anyxml");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_ANYXML);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_anydata((lys_module *)ext_local
                                                                             ,(lys_node *)yin_local,
                                                                             child,LYS_ANYXML,1,
                                                                             (unres_schema *)next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"case");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,LY_STMT_CASE
                                                                    );
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_case((lys_module *)
                                                                              ext_local,
                                                                              (lys_node *)yin_local,
                                                                              child,1,(unres_schema
                                                                                       *)next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"choice");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_CHOICE);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_choice((lys_module *)ext_local,
                                                                            (lys_node *)yin_local,
                                                                            child,1,(unres_schema *)
                                                                                    next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"container");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,
                                                                     LY_STMT_CONTAINER);
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_container((lys_module *)
                                                                                   ext_local,
                                                                                   (lys_node *)
                                                                                   yin_local,child,1
                                                                                   ,(unres_schema *)
                                                                                    next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"grouping");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_GROUPING);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_grouping((lys_module *)
                                                                              ext_local,
                                                                              (lys_node *)yin_local,
                                                                              child,1,(unres_schema
                                                                                       *)next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"output");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,
                                                                     LY_STMT_OUTPUT);
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_input_output
                                                                          ((lys_module *)ext_local,
                                                                           (lys_node *)yin_local,
                                                                           child,1,(unres_schema *)
                                                                                   next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"input");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,LY_STMT_INPUT
                                                  );
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_input_output
                                                                      ((lys_module *)ext_local,
                                                                       (lys_node *)yin_local,child,1
                                                                       ,(unres_schema *)next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"leaf");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,LY_STMT_LEAF
                                                                    );
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_leaf((lys_module *)
                                                                              ext_local,
                                                                              (lys_node *)yin_local,
                                                                              child,1,(unres_schema
                                                                                       *)next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"leaf-list");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_LEAFLIST);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_leaflist((lys_module *)
                                                                              ext_local,
                                                                              (lys_node *)yin_local,
                                                                              child,1,(unres_schema
                                                                                       *)next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"list");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_node
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,LY_STMT_LIST
                                                                    );
                                                      if ((lys_node **)p == (lys_node **)0x0) {
                                                        return 1;
                                                      }
                                                      plVar10 = read_yin_list((lys_module *)
                                                                              ext_local,
                                                                              (lys_node *)yin_local,
                                                                              child,1,(unres_schema
                                                                                       *)next);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(child->name,"notification");
                                                      if (iVar1 == 0) {
                                                        p = yin_getplace_for_extcomplex_node
                                                                      (child,(
                                                  lys_ext_instance_complex *)yin_local,
                                                  LY_STMT_NOTIFICATION);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_notif((lys_module *)ext_local,
                                                                           (lys_node *)yin_local,
                                                                           child,1,(unres_schema *)
                                                                                   next);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"uses");
                                                    if (iVar1 != 0) {
                                                      iVar1 = strcmp(child->name,"length");
                                                      if (iVar1 == 0) {
                                                        reallocated = lys_ext_complex_get_substmt
                                                                                (LY_STMT_LENGTH,
                                                                                 (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  pvVar2 = calloc(1,0x38);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  pcVar11 = lydict_insert((ly_ctx *)ext_local->def,
                                                                          name,0);
                                                  **reallocated = pcVar11;
                                                  iVar1 = read_restr_substmt((lys_module *)ext_local
                                                                             ,*reallocated,child,
                                                                             (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"must");
                                                    if (iVar1 == 0) {
                                                      p = yin_getplace_for_extcomplex_struct
                                                                    (child,(lys_ext_instance_complex
                                                                            *)yin_local,LY_STMT_MUST
                                                                    );
                                                      if ((void **)p == (void **)0x0) {
                                                        return 1;
                                                      }
                                                      pvVar2 = calloc(1,0x38);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  iVar1 = fill_yin_must((lys_module *)ext_local,
                                                                        child,*p,(unres_schema *)
                                                                                 next);
                                                  goto joined_r0x001452f7;
                                                  }
                                                  iVar1 = strcmp(child->name,"pattern");
                                                  if (iVar1 == 0) {
                                                    reallocated = lys_ext_complex_get_substmt
                                                                            (LY_STMT_PATTERN,
                                                                             (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_check_pattern((ly_ctx *)ext_local->def
                                                                            ,name,(pcre **)0x0);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  pvVar2 = calloc(1,0x38);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  info._7_1_ = 6;
                                                  if (1 < ((byte)(*(ushort *)&ext_local->substmt >>
                                                                 1) & 7)) {
                                                    endptr = (char *)0x0;
                                                    for (type = (lys_type **)child->child;
                                                        type != (lys_type **)0x0;
                                                        type = (lys_type **)type[4]) {
                                                      if (((type[7] != (lys_type *)0x0) &&
                                                          (iVar1 = strcmp((type[7]->info).lref.path,
                                                                                                                                                    
                                                  "urn:ietf:params:xml:ns:yang:yin:1"), iVar1 == 0))
                                                  && (iVar1 = strcmp((char *)type[6],"modifier"),
                                                     iVar1 == 0)) {
                                                    if (endptr != (char *)0x0) {
                                                      ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                              LY_VLOG_NONE,(void *)0x0,"modifier",
                                                              child->name);
                                                      return 1;
                                                    }
                                                    endptr = lyxml_get_attr((lyxml_elem *)type,
                                                                            "value",(char *)0x0);
                                                    if (endptr == (char *)0x0) {
                                                      ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                              LY_VLOG_NONE,(void *)0x0,"value",
                                                              type[6]);
                                                      return 1;
                                                    }
                                                    iVar1 = strcmp(endptr,"invert-match");
                                                    if (iVar1 != 0) {
                                                      ly_vlog((ly_ctx *)ext_local->def,LYE_INARG,
                                                              LY_VLOG_NONE,(void *)0x0,endptr,
                                                              "modifier");
                                                      return 1;
                                                    }
                                                    info._7_1_ = 0x15;
                                                    iVar1 = lyp_yin_parse_subnode_ext
                                                                      ((lys_module *)ext_local,
                                                                       *reallocated,LYEXT_PAR_RESTR,
                                                                       (lyxml_elem *)type,
                                                                       LYEXT_SUBSTMT_MODIFIER,'\0',
                                                                       (unres_schema *)next);
                                                    if (iVar1 != 0) {
                                                      return 1;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  sVar12 = strlen(name);
                                                  pvVar2 = malloc(sVar12 + 2);
                                                  **reallocated = pvVar2;
                                                  if (**reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  *(undefined1 *)**reallocated = info._7_1_;
                                                  strcpy((char *)(**reallocated + 1),name);
                                                  lydict_insert_zc((ly_ctx *)ext_local->def,
                                                                   (char *)**reallocated);
                                                  iVar1 = read_restr_substmt((lys_module *)ext_local
                                                                             ,*reallocated,child,
                                                                             (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strcmp(child->name,"range");
                                                    if (iVar1 == 0) {
                                                      reallocated = lys_ext_complex_get_substmt
                                                                              (LY_STMT_RANGE,
                                                                               (
                                                  lys_ext_instance_complex *)yin_local,
                                                  (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  name = lyxml_get_attr(child,"value",(char *)0x0);
                                                  if (name == (char *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_MISSARG,
                                                            LY_VLOG_NONE,(void *)0x0,"value",
                                                            child->name);
                                                    return 1;
                                                  }
                                                  pvVar2 = calloc(1,0x38);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  pcVar11 = lydict_insert((ly_ctx *)ext_local->def,
                                                                          name,0);
                                                  **reallocated = pcVar11;
                                                  iVar1 = read_restr_substmt((lys_module *)ext_local
                                                                             ,*reallocated,child,
                                                                             (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    ctx = (ly_ctx *)ext_local->def;
                                                    pLVar13 = ly_errno_glob_address();
                                                    ly_log(ctx,LY_LLERR,*pLVar13,
                                                                                                                      
                                                  "Extension\'s substatement \"%s\" not supported.")
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00147e8a;
                                                  }
                                                  p = yin_getplace_for_extcomplex_node
                                                                (child,(lys_ext_instance_complex *)
                                                                       yin_local,LY_STMT_USES);
                                                  if ((lys_node **)p == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar10 = read_yin_uses((lys_module *)ext_local,
                                                                          (lys_node *)yin_local,
                                                                          child,1,(unres_schema *)
                                                                                  next);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto joined_r0x00147269;
                                                  }
                                                  reallocated = lys_ext_complex_get_substmt
                                                                          (LY_STMT_UNIQUE,
                                                                           (lys_ext_instance_complex
                                                                            *)yin_local,
                                                                           (lyext_substmt **)&v);
                                                  if ((long *)reallocated == (long *)0x0) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_INCHILDSTMT
                                                            ,LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  if ((*(uint *)(v + 0x10) < 2) &&
                                                     (*reallocated != 0)) {
                                                    ly_vlog((ly_ctx *)ext_local->def,LYE_TOOMANY,
                                                            LY_VLOG_NONE,(void *)0x0,child->name,
                                                            child->parent->name);
                                                    return 1;
                                                  }
                                                  p = (void *)0x0;
                                                  local_ac = 0;
                                                  if (1 < *(uint *)(v + 0x10)) {
                                                    p = reallocated;
                                                    if (*reallocated == 0) {
                                                      pvVar2 = malloc(0x10);
                                                      *(void **)p = pvVar2;
                                                      if (*p == 0) {
                                                        ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                               LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  }
                                                  else {
                                                    local_ac = 0;
                                                    while (*(long *)(*reallocated +
                                                                    (long)local_ac * 8) != 0) {
                                                      local_ac = local_ac + 1;
                                                    }
                                                  }
                                                  reallocated = (void *)(*p + (long)local_ac * 8);
                                                  }
                                                  pvVar2 = calloc(1,0x10);
                                                  *(void **)reallocated = pvVar2;
                                                  if (*reallocated == 0) {
                                                    ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM
                                                           ,"Memory allocation failed (%s()).",
                                                           "lyp_yin_parse_complex_ext");
                                                    return 1;
                                                  }
                                                  iVar1 = fill_yin_unique((lys_module *)ext_local,
                                                                          (lys_node *)yin_local,
                                                                          child,*reallocated,
                                                                          (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  iVar1 = lyp_yin_parse_subnode_ext
                                                                    ((lys_module *)ext_local,
                                                                     yin_local,LYEXT_PAR_EXTINST,
                                                                     child,LYEXT_SUBSTMT_UNIQUE,
                                                                     (uint8_t)local_ac,
                                                                     (unres_schema *)next);
                                                  if (iVar1 != 0) {
                                                    return 1;
                                                  }
                                                  if (p != (void *)0x0) {
                                                    value = (char *)realloc(*p,(long)(local_ac + 2)
                                                                               << 3);
                                                    if (value == (char *)0x0) {
                                                      ly_log((ly_ctx *)ext_local->def,LY_LLERR,
                                                             LY_EMEM,
                                                  "Memory allocation failed (%s()).",
                                                  "lyp_yin_parse_complex_ext");
                                                  return 1;
                                                  }
                                                  *(char **)p = value;
                                                  *(undefined8 *)(*p + (long)(local_ac + 1) * 8) = 0
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00147e8a;
                                                  }
                                                  iVar1 = yin_parse_extcomplex_bool
                                                                    ((lys_module *)ext_local,child,
                                                                     (lys_ext_instance_complex *)
                                                                     yin_local,LY_STMT_MODIFIER,
                                                                     "invert-match",(char *)0x0,
                                                                     (unres_schema *)next);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto joined_r0x001452f7;
      }
      pp = yin_getplace_for_extcomplex_struct
                     (child,(lys_ext_instance_complex *)yin_local,LY_STMT_TYPE);
      if (pp == (void **)0x0) {
        return 1;
      }
      pvVar2 = calloc(1,0x40);
      *pp = pvVar2;
      if (*pp == (void *)0x0) {
        ly_log((ly_ctx *)ext_local->def,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyp_yin_parse_complex_ext");
        return 1;
      }
      lyxml_unlink((ly_ctx *)ext_local->def,child);
      *(lyxml_elem **)((long)*pp + 0x10) = child;
      *(lyxml_elem **)((long)*pp + 0x18) = yin_local;
      iVar1 = unres_schema_add_node
                        ((lys_module *)ext_local,(unres_schema *)next,*pp,UNRES_TYPE_DER_EXT,
                         (lys_node *)0x0);
      if (iVar1 == -1) {
        *(undefined8 *)((long)*pp + 0x10) = 0;
        return 1;
      }
    }
    child = node;
  } while( true );
}

Assistant:

int
lyp_yin_parse_complex_ext(struct lys_module *mod, struct lys_ext_instance_complex *ext, struct lyxml_elem *yin,
                          struct unres_schema *unres)
{
    struct lyxml_elem *next, *node, *child;
    struct lys_type **type;
    void **pp, *p, *reallocated;
    const char *value, *name;
    char *endptr, modifier;
    struct lyext_substmt *info;
    long int v;
    long long int ll;
    unsigned long u;
    int i, j;

#define YIN_STORE_VALUE(TYPE, FROM, TO)           \
    *(TYPE **)TO = malloc(sizeof(TYPE));          \
    if (!*(TYPE **)TO) { LOGMEM(mod->ctx); goto error; }    \
    (**(TYPE **)TO) = (TYPE)FROM;

#define YIN_EXTCOMPLEX_GETPLACE(STMT, TYPE)                                          \
    p = lys_ext_complex_get_substmt(STMT, ext, &info);                               \
    if (!p) {                                                                        \
        LOGVAL(mod->ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node->name, node->parent->name); \
        goto error;                                                                  \
    }                                                                                \
    if (info->cardinality < LY_STMT_CARD_SOME && (*(TYPE*)p)) {                      \
        LOGVAL(mod->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, node->name, node->parent->name);     \
        goto error;                                                                  \
    }                                                                                \
    pp = NULL; i = 0;                                                                \
    if (info->cardinality >= LY_STMT_CARD_SOME) {                                    \
        /* there can be multiple instances */                                        \
        pp = p;                                                                      \
        if (!(*pp)) {                                                                \
            *pp = malloc(2 * sizeof(TYPE)); /* allocate initial array */             \
            LY_CHECK_ERR_GOTO(!*pp, LOGMEM(mod->ctx), error);                        \
        } else {                                                                     \
            for (i = 0; (*(TYPE**)pp)[i]; i++);                                      \
        }                                                                            \
        p = &(*(TYPE**)pp)[i];                                                       \
    }